

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

int __thiscall Dice::rollDiceDetermineStart(Dice *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar2 = 0;
  iVar3 = 8;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    iVar1 = rand();
    iVar2 = iVar2 + (uint)(iVar1 % 6 == 1);
  }
  return iVar2;
}

Assistant:

int Dice::rollDiceDetermineStart(){

    DiceOptions value;
    int numbOfAttacks=0;
    for(int i=0; i<8; i++)
    {
        value = randomDiceOption();
        if(value == DiceOptions::Attack)
        {
            numbOfAttacks++;
        }
    }
    return numbOfAttacks;
}